

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADE_DEP_DPFSP.cpp
# Opt level: O1

uint __thiscall ADE_DEP_DPFSP::valutaIndividuo(ADE_DEP_DPFSP *this,Permutazione *p)

{
  ushort uVar1;
  ushort uVar2;
  unsigned_short *puVar3;
  uint **ppuVar4;
  int *__s;
  int iVar5;
  uint uVar6;
  ushort uVar7;
  short sVar8;
  ulong uVar9;
  uint *puVar10;
  ulong uVar11;
  uint uVar12;
  
  uVar1 = (this->istanza).macchine;
  uVar11 = (ulong)uVar1;
  uVar9 = (ulong)uVar1 << 2;
  __s = (int *)operator_new__(uVar9);
  uVar12 = 0;
  memset(__s,0,uVar9);
  uVar1 = (this->istanza).lavori;
  iVar5 = (uint)(this->istanza).fabbriche + (uint)uVar1 + -1;
  if (0 < iVar5) {
    puVar3 = p->individuo;
    ppuVar4 = (this->istanza).p;
    uVar7 = 0;
    sVar8 = 0;
    uVar12 = 0;
    do {
      uVar2 = puVar3[uVar7];
      if (uVar2 < uVar1) {
        if (uVar11 != 0) {
          uVar9 = 0;
          do {
            if (sVar8 == 0 && (short)uVar9 == 0) {
              __s[uVar9] = *ppuVar4[uVar2];
            }
            else {
              if (uVar9 == 0 || sVar8 == 0) {
                if (sVar8 != 0 || uVar9 == 0) {
                  *__s = *__s + *ppuVar4[uVar2];
                  goto LAB_0010565f;
                }
                puVar10 = ppuVar4[uVar2];
                uVar6 = __s[uVar9 - 1];
              }
              else {
                uVar6 = __s[uVar9];
                if ((uint)__s[uVar9] < (uint)__s[(int)uVar9 - 1]) {
                  uVar6 = __s[(int)uVar9 - 1];
                }
                puVar10 = ppuVar4[uVar2];
              }
              __s[uVar9] = uVar6 + puVar10[uVar9];
            }
LAB_0010565f:
            uVar9 = uVar9 + 1;
          } while (uVar11 != uVar9);
        }
        sVar8 = sVar8 + 1;
      }
      else {
        if (uVar12 <= (uint)__s[uVar11 - 1]) {
          uVar12 = __s[uVar11 - 1];
        }
        sVar8 = 0;
      }
      uVar7 = uVar7 + 1;
    } while ((int)(uint)uVar7 < iVar5);
  }
  uVar6 = __s[uVar11 - 1];
  if ((uint)__s[uVar11 - 1] < uVar12) {
    uVar6 = uVar12;
  }
  operator_delete__(__s);
  return uVar6;
}

Assistant:

unsigned int ADE_DEP_DPFSP::valutaIndividuo(Permutazione* p) {

	auto Cm = make_unique<unsigned int[]>(istanza.macchine);

	unsigned int Cmax = 0;
	short c = 0;

	for (unsigned short k = 0; k < istanza.lavori + istanza.fabbriche - 1; k++, c++) {

		if (p->individuo[k] >= istanza.lavori) {
			Cmax = max(Cmax, Cm[istanza.macchine - 1]);
			c = -1;
		}
		else {
			for (unsigned short j = 0; j < istanza.macchine; j++) {

				if (c == 0 && j == 0) {
					Cm[j] = istanza.p[p->individuo[k]][0];
				}
				else if (c != 0 && j != 0) {
					Cm[j] = istanza.p[p->individuo[k]][j] + max(Cm[j - 1], Cm[j]);
				}
				else if (c == 0 && j != 0) {
					Cm[j] = istanza.p[p->individuo[k]][j] + Cm[j - 1];
				}
				else {
					Cm[0] = istanza.p[p->individuo[k]][0] + Cm[0];
				}
			}
		}
	}

	return max(Cmax, Cm[istanza.macchine - 1]);
}